

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

RowSetEntry * rowSetEntryMerge(RowSetEntry *pA,RowSetEntry *pB)

{
  RowSetEntry **ppRVar1;
  long lVar2;
  RowSetEntry *pRVar3;
  RowSetEntry *pRVar4;
  RowSetEntry head;
  
  pRVar3 = &head;
  do {
    pRVar4 = pA;
    lVar2 = pRVar4->v;
    while (pB->v < lVar2) {
      pRVar3->pRight = pB;
      ppRVar1 = &pB->pRight;
      pRVar3 = pB;
      pB = *ppRVar1;
      if (*ppRVar1 == (RowSetEntry *)0x0) goto LAB_00156101;
    }
    if (lVar2 < pB->v) {
      pRVar3->pRight = pRVar4;
      pRVar3 = pRVar4;
    }
    ppRVar1 = &pRVar4->pRight;
    pRVar4 = pB;
    pA = *ppRVar1;
  } while (*ppRVar1 != (RowSetEntry *)0x0);
LAB_00156101:
  pRVar3->pRight = pRVar4;
  return head.pRight;
}

Assistant:

static struct RowSetEntry *rowSetEntryMerge(
  struct RowSetEntry *pA,    /* First sorted list to be merged */
  struct RowSetEntry *pB     /* Second sorted list to be merged */
){
  struct RowSetEntry head;
  struct RowSetEntry *pTail;

  pTail = &head;
  assert( pA!=0 && pB!=0 );
  for(;;){
    assert( pA->pRight==0 || pA->v<=pA->pRight->v );
    assert( pB->pRight==0 || pB->v<=pB->pRight->v );
    if( pA->v<=pB->v ){
      if( pA->v<pB->v ) pTail = pTail->pRight = pA;
      pA = pA->pRight;
      if( pA==0 ){
        pTail->pRight = pB;
        break;
      }
    }else{
      pTail = pTail->pRight = pB;
      pB = pB->pRight;
      if( pB==0 ){
        pTail->pRight = pA;
        break;
      }
    }
  }
  return head.pRight;
}